

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int lys_check_xpath(lys_node *node,int check_place,int warn_on_fwd_ref)

{
  byte *pbVar1;
  uint16_t flags1;
  uint16_t flags2;
  char *name1;
  uint uVar2;
  int iVar3;
  lys_node *plVar4;
  lys_module *mod1;
  lys_module *mod2;
  lys_node *plVar5;
  long lVar6;
  ulong uVar7;
  undefined1 local_88 [8];
  lyxp_set set;
  
  plVar4 = node;
  if (check_place == 0) {
LAB_00116432:
    uVar2 = lyxp_node_atomize(node,(lyxp_set *)local_88,warn_on_fwd_ref);
    plVar4 = node;
    if (uVar2 == 0xffffffff) {
      uVar2 = 0xffffffff;
    }
    else {
      for (; (plVar4 != (lys_node *)0x0 &&
             ((plVar4->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN));
          plVar4 = lys_parent(plVar4)) {
      }
      for (uVar7 = 0; uVar7 < (uint)set.val._8_4_; uVar7 = uVar7 + 1) {
        lVar6 = uVar7 * 0x10;
        if (*(int *)(set._8_8_ + 8 + lVar6) == 2) {
          flags1 = node->flags;
          mod1 = lys_node_module(node);
          name1 = node->name;
          flags2 = (*(lys_node **)(set._8_8_ + lVar6))->flags;
          mod2 = lys_node_module(*(lys_node **)(set._8_8_ + lVar6));
          iVar3 = lyp_check_status(flags1,mod1,name1,flags2,mod2,
                                   (char *)**(undefined8 **)(set._8_8_ + lVar6),node);
          if (iVar3 != 0) {
            return -1;
          }
          if (plVar4 != (lys_node *)0x0) {
            for (plVar5 = *(lys_node **)(set._8_8_ + lVar6);
                (plVar5 != (lys_node *)0x0 && (plVar5 != plVar4)); plVar5 = lys_parent(plVar5)) {
            }
            if (plVar5 == (lys_node *)0x0) {
              pbVar1 = (byte *)((long)&node->flags + 1);
              *pbVar1 = *pbVar1 | 2;
              break;
            }
          }
        }
      }
      free((void *)set._8_8_);
    }
  }
  else {
    do {
      while( true ) {
        plVar5 = plVar4;
        if (plVar5 == (lys_node *)0x0) goto LAB_00116432;
        if (plVar5->nodetype == LYS_AUGMENT) break;
        if (plVar5->nodetype == LYS_GROUPING) {
          return 0;
        }
        plVar4 = plVar5->parent;
      }
      plVar4 = plVar5->prev;
    } while (plVar5->prev != (lys_node *)0x0);
    uVar2 = (uint)((byte)plVar5->module->field_0x40 >> 7);
  }
  return uVar2;
}

Assistant:

int
lys_check_xpath(struct lys_node *node, int check_place, int warn_on_fwd_ref)
{
    struct lys_node *parent, *elem;
    struct lyxp_set set;
    uint32_t i;
    int ret;

    if (check_place) {
        parent = node;
        while (parent) {
            if (parent->nodetype == LYS_GROUPING) {
                /* unresolved grouping, skip for now (will be checked later) */
                return EXIT_SUCCESS;
            }
            if (parent->nodetype == LYS_AUGMENT) {
                if (!((struct lys_node_augment *)parent)->target) {
                    /* unresolved augment */
                    if (parent->module->implemented) {
                        /* skip for now (will be checked later) */
                        return EXIT_FAILURE;
                    } else {
                        /* not implemented augment, skip resolving */
                        return EXIT_SUCCESS;
                    }
                } else {
                    parent = ((struct lys_node_augment *)parent)->target;
                    continue;
                }
            }
            parent = parent->parent;
        }
    }

    ret = lyxp_node_atomize(node, &set, warn_on_fwd_ref);
    if (ret == -1) {
        return -1;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)); parent = lys_parent(parent));

    for (i = 0; i < set.used; ++i) {
        /* skip roots'n'stuff */
        if (set.val.snodes[i].type == LYXP_NODE_ELEM) {
            /* XPath expression cannot reference "lower" status than the node that has the definition */
            if (lyp_check_status(node->flags, lys_node_module(node), node->name, set.val.snodes[i].snode->flags,
                    lys_node_module(set.val.snodes[i].snode), set.val.snodes[i].snode->name, node)) {
                return -1;
            }

            if (parent) {
                for (elem = set.val.snodes[i].snode; elem && (elem != parent); elem = lys_parent(elem));
                if (!elem) {
                    /* not in node's RPC or notification subtree, set the flag */
                    node->flags |= LYS_XPATH_DEP;
                    break;
                }
            }
        }
    }

    free(set.val.snodes);
    return ret;
}